

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O1

int __thiscall
ProjectBuilderMakefileGenerator::pbuilderVersion(ProjectBuilderMakefileGenerator *this)

{
  QMakeProject *pQVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  ProKey local_88;
  ProString local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_58,"QMAKE_PBUILDER_VERSION");
  bVar2 = QMakeProject::isEmpty(pQVar1,(ProKey *)&local_58);
  if (&(local_58.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_58.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar3 = 0x2e;
  if (!bVar2) {
    pQVar1 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_88,"QMAKE_PBUILDER_VERSION");
    QMakeEvaluator::first(&local_58,&pQVar1->super_QMakeEvaluator,&local_88);
    iVar3 = ProString::toInt(&local_58,(bool *)0x0,10);
    if (&(local_58.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_58.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_58.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int
ProjectBuilderMakefileGenerator::pbuilderVersion() const
{
    if (!project->isEmpty("QMAKE_PBUILDER_VERSION"))
        return project->first("QMAKE_PBUILDER_VERSION").toInt();
    return 46; // Xcode 3.2-compatible; default format since that version
}